

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O2

RC __thiscall
PF_FileHandle::GetPrevPage(PF_FileHandle *this,PageNum current,PF_PageHandle *pageHandle)

{
  int iVar1;
  RC RVar2;
  
  if (this->bFileOpen == 0) {
    RVar2 = 5;
  }
  else {
    iVar1 = (this->hdr).numPages;
    if ((iVar1 == current) || (current < iVar1 && -1 < current)) {
      do {
        if (current < 1) {
          return 8;
        }
        current = current + -1;
        RVar2 = GetThisPage(this,current,pageHandle);
      } while (RVar2 == 3);
    }
    else {
      RVar2 = 3;
    }
  }
  return RVar2;
}

Assistant:

RC PF_FileHandle::GetPrevPage(PageNum current, PF_PageHandle &pageHandle) const
{
   int rc;               // return code

   // File must be open
   if (!bFileOpen)
      return (PF_CLOSEDFILE);

   // Validate page number (note that hdr.numPages is acceptable here)
   if (current != hdr.numPages &&  !IsValidPageNum(current))
      return (PF_INVALIDPAGE);

   // Scan the file until a valid used page is found
   for (current--; current >= 0; current--) {

      // If this is a valid (used) page, we're done
      if (!(rc = GetThisPage(current, pageHandle)))
         return (0);

      // If unexpected error, return it
      if (rc != PF_INVALIDPAGE)
         return (rc);
   }

   // No valid (used) page found
   return (PF_EOF);
}